

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O0

void Saig_ManWindowInsertSmall_rec
               (Aig_Man_t *pNew,Aig_Obj_t *pObjSmall,Vec_Ptr_t *vBigNode2SmallPo,
               Vec_Ptr_t *vSmallPi2BigNode)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p1;
  Aig_Obj_t *pMatch;
  Vec_Ptr_t *vSmallPi2BigNode_local;
  Vec_Ptr_t *vBigNode2SmallPo_local;
  Aig_Obj_t *pObjSmall_local;
  Aig_Man_t *pNew_local;
  
  if ((pObjSmall->field_5).pData == (void *)0x0) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vSmallPi2BigNode,pObjSmall->Id);
    if (pAVar2 == (Aig_Obj_t *)0x0) {
      iVar1 = Aig_ObjIsNode(pObjSmall);
      if (iVar1 == 0) {
        __assert_fail("Aig_ObjIsNode(pObjSmall)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                      ,0x14d,
                      "void Saig_ManWindowInsertSmall_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      pAVar2 = Aig_ObjFanin0(pObjSmall);
      Saig_ManWindowInsertSmall_rec(pNew,pAVar2,vBigNode2SmallPo,vSmallPi2BigNode);
      pAVar2 = Aig_ObjFanin1(pObjSmall);
      Saig_ManWindowInsertSmall_rec(pNew,pAVar2,vBigNode2SmallPo,vSmallPi2BigNode);
      pAVar2 = Aig_ObjChild0Copy(pObjSmall);
      p1 = Aig_ObjChild1Copy(pObjSmall);
      pAVar2 = Aig_And(pNew,pAVar2,p1);
      (pObjSmall->field_5).pData = pAVar2;
    }
    else {
      Saig_ManWindowInsertBig_rec(pNew,pAVar2,vBigNode2SmallPo,vSmallPi2BigNode);
      pObjSmall->field_5 = pAVar2->field_5;
    }
  }
  return;
}

Assistant:

void Saig_ManWindowInsertSmall_rec( Aig_Man_t * pNew, Aig_Obj_t * pObjSmall, 
         Vec_Ptr_t * vBigNode2SmallPo, Vec_Ptr_t * vSmallPi2BigNode )
{
    Aig_Obj_t * pMatch;
    if ( pObjSmall->pData )
        return;
    if ( (pMatch = (Aig_Obj_t *)Vec_PtrEntry( vSmallPi2BigNode, pObjSmall->Id )) )
    {
        Saig_ManWindowInsertBig_rec( pNew, pMatch, vBigNode2SmallPo, vSmallPi2BigNode );
        pObjSmall->pData = pMatch->pData;
        return;        
    }
    assert( Aig_ObjIsNode(pObjSmall) );
    Saig_ManWindowInsertSmall_rec( pNew, Aig_ObjFanin0(pObjSmall), vBigNode2SmallPo, vSmallPi2BigNode );
    Saig_ManWindowInsertSmall_rec( pNew, Aig_ObjFanin1(pObjSmall), vBigNode2SmallPo, vSmallPi2BigNode );
    pObjSmall->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObjSmall), Aig_ObjChild1Copy(pObjSmall) );
}